

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O3

void __thiscall ProjectWriter::writePumps(ProjectWriter *this)

{
  undefined1 *puVar1;
  double dVar2;
  pointer ppLVar3;
  Link *pLVar4;
  long lVar5;
  long lVar6;
  pointer pcVar7;
  int iVar8;
  ostream *poVar9;
  Pump *pump;
  pointer ppLVar10;
  
  puVar1 = &this->field_0x18;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\n[PUMPS]\n",9);
  ppLVar3 = (this->network->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppLVar10 = (this->network->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>._M_impl
                  .super__Vector_impl_data._M_start; ppLVar10 != ppLVar3; ppLVar10 = ppLVar10 + 1) {
    pLVar4 = *ppLVar10;
    iVar8 = (*(pLVar4->super_Element)._vptr_Element[2])(pLVar4);
    if (iVar8 == 1) {
      lVar5 = *(long *)&this->field_0x18;
      lVar6 = *(long *)(lVar5 + -0x18);
      *(uint *)(&this->field_0x30 + lVar6) =
           *(uint *)(&this->field_0x30 + lVar6) & 0xffffff4f | 0x20;
      *(undefined8 *)(&this->field_0x28 + *(long *)(lVar5 + -0x18)) = 0x10;
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)puVar1,(pLVar4->super_Element).name._M_dataplus._M_p,
                          (pLVar4->super_Element).name._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
      *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0x10;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)puVar1,(pLVar4->fromNode->super_Element).name._M_dataplus._M_p,
                 (pLVar4->fromNode->super_Element).name._M_string_length);
      *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0x10;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)puVar1,(pLVar4->toNode->super_Element).name._M_dataplus._M_p,
                 (pLVar4->toNode->super_Element).name._M_string_length);
      lVar5 = *(long *)&this->field_0x18;
      *(uint *)(&this->field_0x30 + *(long *)(lVar5 + -0x18)) =
           *(uint *)(&this->field_0x30 + *(long *)(lVar5 + -0x18)) & 0xfffffefb | 4;
      *(undefined8 *)(&this->field_0x20 + *(long *)(lVar5 + -0x18)) = 4;
      if (0.0 < (double)pLVar4[1].super_Element.name._M_string_length) {
        *(undefined8 *)(&this->field_0x28 + *(long *)(lVar5 + -0x18)) = 8;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"POWER",5);
        *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0xc;
        std::ostream::_M_insert<double>
                  ((double)pLVar4[1].super_Element.name._M_string_length *
                   (this->network->units).factors[3]);
      }
      if (*(int *)&pLVar4[1].super_Element._vptr_Element != 0) {
        *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 8;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"HEAD",4);
        *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0x10;
        pcVar7 = pLVar4[1].super_Element.name._M_dataplus._M_p;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)puVar1,*(char **)(pcVar7 + 8),*(long *)(pcVar7 + 0x10));
      }
      dVar2 = pLVar4[1].initSetting;
      if ((0.0 < dVar2) && ((dVar2 != 1.0 || (NAN(dVar2))))) {
        *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 8;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"SPEED",5);
        *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 8;
        std::ostream::_M_insert<double>(pLVar4[1].initSetting);
      }
      if (*(long *)&pLVar4[1].status != 0) {
        *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 8;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"PATTERN",7);
        *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0x10;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)puVar1,*(char **)(*(long *)&pLVar4[1].status + 8),
                   *(long *)(*(long *)&pLVar4[1].status + 0x10));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\n",1);
    }
  }
  return;
}

Assistant:

void ProjectWriter::writePumps()
{
    fout << "\n[PUMPS]\n";
    for (Link* link : network->links)
    {
        if ( link->type() == Link::PUMP )
        {
            Pump* pump = static_cast<Pump*>(link);
            fout << left << setw(16) << link->name << " ";
            fout << setw(16) << link->fromNode->name;
            fout << setw(16) << link->toNode->name;
            fout << fixed << setprecision(4);

            if ( pump->pumpCurve.horsepower > 0.0 )
            {
                fout << setw(8) << "POWER";
                fout << setw(12) << pump->pumpCurve.horsepower * network->ucf(Units::POWER);
            }

            if ( pump->pumpCurve.curveType != PumpCurve::NO_CURVE )
            {
                fout << setw(8) << "HEAD";
                fout << setw(16) << pump->pumpCurve.curve->name;
            }

            if ( pump->speed > 0.0 && pump->speed != 1.0 )
            {
                fout << setw(8) << "SPEED";
                fout << setw(8) << pump->speed;
            }

            if ( pump->speedPattern )
            {
                fout << setw(8) << "PATTERN";
                fout << setw(16) << pump->speedPattern->name;
            }
            fout << "\n";
        }
    }
}